

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_39db::TlbExportVisitor::visit_(TlbExportVisitor *this,Array *type)

{
  ostream *poVar1;
  ulong uVar2;
  TlbExportVisitor local_68 [48];
  TlbExportVisitor local_38 [32];
  Indirect *local_18;
  Array *type_local;
  TlbExportVisitor *this_local;
  
  local_18 = (Indirect *)type;
  type_local = (Array *)this;
  std::operator<<(this->m_stream,"<array ");
  indirect(this->m_stream,local_18);
  poVar1 = std::operator<<(this->m_stream," dimension=\"");
  uVar2 = Typelib::Array::getDimension();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1,"\" ");
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_(local_38);
  poVar1 = std::operator<<(poVar1,(string *)local_38);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string((string *)local_38);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_(local_68,(Type *)this);
  poVar1 = std::operator<<(poVar1,(string *)local_68);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)local_68);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  std::operator<<(poVar1,"</array>");
  return true;
}

Assistant:

bool TlbExportVisitor::visit_ (Array const& type)
    {
        m_stream << "<array ";
        indirect(m_stream, type);
        m_stream << " dimension=\"" << type.getDimension() << "\" " << emitSourceID() << ">\n";
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</array>";
        return true;
    }